

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_flux_mx(TrackData *trackdata,DataRate last_datarate)

{
  DataRate datarate;
  __normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_> __src;
  __normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_> __dest;
  bool bVar1;
  int bitcell_ns;
  FluxData *flux_revs;
  Track *this;
  size_t __n;
  DataRate *pDVar2;
  pointer pDVar3;
  initializer_list<DataRate> __l;
  __normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_> local_110;
  vector<DataRate,_std::allocator<DataRate>_> datarates;
  DataRate last_datarate_local;
  pointer local_e8;
  reverse_iterator<__gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>_>
  local_e0;
  FluxDecoder decoder;
  BitBuffer bitbuf;
  
  bitbuf._4_8_ = 0x493e00003d090;
  __l._M_len = 3;
  __l._M_array = &bitbuf.datarate;
  bitbuf.datarate = last_datarate;
  std::vector<DataRate,_std::allocator<DataRate>_>::vector
            (&datarates,__l,(allocator_type *)&decoder);
  local_e0.current._M_current =
       (__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>)
       (__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>)
       datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8 = datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<DataRate*,std::vector<DataRate,std::allocator<DataRate>>>>,DataRate>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>_>
              *)&local_110,&local_e0,(DataRate *)&local_e8);
  __src._M_current = local_110._M_current;
  __dest._M_current = local_110._M_current + -1;
  pDVar3 = datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_110._M_current !=
      datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __n = (long)datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)local_110._M_current;
    local_110._M_current = __dest._M_current;
    memmove(__dest._M_current,__src._M_current,__n);
    pDVar3 = datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
             super__Vector_impl_data._M_start;
    __dest._M_current = local_110._M_current;
  }
  local_110._M_current = __dest._M_current;
  pDVar2 = datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.super__Vector_impl_data.
  _M_finish = pDVar2;
  do {
    if (pDVar3 == pDVar2) break;
    datarate = *pDVar3;
    flux_revs = TrackData::flux(trackdata);
    bitcell_ns = ::bitcell_ns(datarate);
    FluxDecoder::FluxDecoder(&decoder,flux_revs,bitcell_ns,opt.scale,4);
    BitBuffer::BitBuffer(&bitbuf,datarate,&decoder);
    TrackData::add(trackdata,&bitbuf);
    scan_bitstream_mx(trackdata);
    this = TrackData::track(trackdata);
    bVar1 = Track::empty(this);
    BitBuffer::~BitBuffer(&bitbuf);
    pDVar3 = pDVar3 + 1;
  } while (bVar1);
  std::_Vector_base<DataRate,_std::allocator<DataRate>_>::~_Vector_base
            (&datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>);
  return;
}

Assistant:

void scan_flux_mx(TrackData& trackdata, DataRate last_datarate)
{
    std::vector<DataRate> datarates = { last_datarate, DataRate::_250K, DataRate::_300K };
    datarates.erase(std::next(std::find(datarates.rbegin(), datarates.rend(), last_datarate)).base());

    for (auto datarate : datarates)
    {
        FluxDecoder decoder(trackdata.flux(), ::bitcell_ns(datarate), opt.scale);
        BitBuffer bitbuf(datarate, decoder);

        trackdata.add(std::move(bitbuf));
        scan_bitstream_mx(trackdata);

        // If we found something there's no need to check other data rates
        if (!trackdata.track().empty())
            break;
    }
}